

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::setup_conservation_tags(Mesh *mesh,AdaptOpts *opts)

{
  Int ent_dim;
  bool bVar1;
  Int IVar2;
  Int IVar3;
  LO LVar4;
  TagBase *pTVar5;
  string *psVar6;
  const_iterator cVar7;
  int i;
  string density_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integral_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  allocator local_f9;
  int local_f8;
  Int local_f4;
  AdaptOpts *local_f0;
  TransferOpts *local_e8;
  _Base_ptr local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d8;
  key_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Write<double> local_70;
  string local_60;
  Write<double> local_40;
  
  local_e8 = &opts->xfer_opts;
  local_f4 = Mesh::dim(mesh);
  local_d8 = &(opts->xfer_opts).integral_map;
  local_e0 = &(opts->xfer_opts).integral_map._M_t._M_impl.super__Rb_tree_header._M_header;
  IVar3 = 0;
  local_f0 = opts;
  do {
    ent_dim = local_f4;
    IVar2 = Mesh::ntags(mesh,local_f4);
    if (IVar2 <= IVar3) {
      local_f0 = (AdaptOpts *)&(local_f0->xfer_opts).velocity_momentum_map;
      i = 0;
      while( true ) {
        IVar3 = Mesh::ntags(mesh,0);
        if (IVar3 <= i) break;
        pTVar5 = Mesh::get_tag(mesh,0,i);
        bVar1 = is_momentum_velocity(mesh,local_e8,0,pTVar5);
        if (bVar1) {
          local_f8 = i;
          psVar6 = TagBase::name_abi_cxx11_(pTVar5);
          std::__cxx11::string::string((string *)&local_d0,(string *)psVar6);
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_f0,&local_d0);
          std::__cxx11::string::string((string *)&local_b0,(string *)(cVar7._M_node + 2));
          std::operator+(&local_90,&local_b0,"_error");
          IVar3 = TagBase::ncomps(pTVar5);
          LVar4 = Mesh::nelems(mesh);
          std::__cxx11::string::string((string *)&local_60,"",&local_f9);
          Read<double>::Read((Read<double> *)&local_70,LVar4 * IVar3,0.0,&local_60);
          Mesh::add_tag<double>(mesh,local_f4,&local_90,IVar3,(Read<double> *)&local_70,false);
          i = local_f8;
          Write<double>::~Write(&local_70);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        i = i + 1;
      }
      return;
    }
    pTVar5 = Mesh::get_tag(mesh,ent_dim,IVar3);
    bVar1 = should_conserve(mesh,local_e8,ent_dim,pTVar5);
    if (bVar1) {
      local_f8 = IVar3;
      psVar6 = TagBase::name_abi_cxx11_(pTVar5);
      std::__cxx11::string::string((string *)&local_d0,(string *)psVar6);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_d8->_M_t,&local_d0);
      if (cVar7._M_node == local_e0) {
        fail("conserved density \"%s\" has no integral_map entry\n",local_d0._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_b0,(string *)(cVar7._M_node + 2));
      std::operator+(&local_90,&local_b0,"_error");
      IVar3 = TagBase::ncomps(pTVar5);
      LVar4 = Mesh::nelems(mesh);
      std::__cxx11::string::string((string *)&local_60,"",&local_f9);
      Read<double>::Read((Read<double> *)&local_40,LVar4 * IVar3,0.0,&local_60);
      Mesh::add_tag<double>(mesh,local_f4,&local_90,IVar3,(Read<double> *)&local_40,false);
      Write<double>::~Write(&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      IVar3 = local_f8;
    }
    IVar3 = IVar3 + 1;
  } while( true );
}

Assistant:

void setup_conservation_tags(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      auto it = xfer_opts.integral_map.find(density_name);
      if (it == xfer_opts.integral_map.end()) {
        Omega_h_fail("conserved density \"%s\" has no integral_map entry\n",
            density_name.c_str());
      }
      auto integral_name = it->second;
      auto error_name = integral_name + "_error";
      auto ncomps = tagbase->ncomps();
      mesh->add_tag(
          dim, error_name, ncomps, Reals(mesh->nelems() * ncomps, 0.0));
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      auto velocity_name = tagbase->name();
      auto momentum_name =
          xfer_opts.velocity_momentum_map.find(velocity_name)->second;
      auto error_name = momentum_name + "_error";
      auto ncomps = tagbase->ncomps();
      mesh->add_tag(
          dim, error_name, ncomps, Reals(mesh->nelems() * ncomps, 0.0));
    }
  }
}